

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall
wallet::CWallet::RecursiveUpdateTxState
          (CWallet *this,uint256 *tx_hash,TryUpdatingStateFn *try_updating_state)

{
  WalletDatabase *pWVar1;
  long in_FS_OFFSET;
  WalletBatch local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar1 = GetDatabase(this);
  (*pWVar1->_vptr_WalletDatabase[0xe])(&local_40,pWVar1,0);
  local_40.m_database = pWVar1;
  RecursiveUpdateTxState(this,&local_40,tx_hash,try_updating_state);
  if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
      local_40.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_40.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::RecursiveUpdateTxState(const uint256& tx_hash, const TryUpdatingStateFn& try_updating_state) {
    // Do not flush the wallet here for performance reasons
    WalletBatch batch(GetDatabase(), false);
    RecursiveUpdateTxState(&batch, tx_hash, try_updating_state);
}